

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floating_point_stream_compression.c
# Opt level: O3

void trico_decompress(uint32_t *number_of_floats,float **out,uint8_t *compressed)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  void *__ptr;
  void *__ptr_00;
  float *pfVar6;
  sbyte sVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  float fVar14;
  ulong uVar15;
  float fVar16;
  byte *pbVar17;
  uint uVar18;
  int j;
  long lVar19;
  uint uVar20;
  size_t __nmemb;
  ulong uVar21;
  uint32_t xor [8];
  uint32_t bcode [8];
  uint auStack_c8 [11];
  uint local_9c;
  uint local_98;
  uint local_94;
  float *local_90;
  void *local_88;
  byte *local_80;
  uint local_78;
  int local_74;
  uint32_t *local_70;
  ulong local_68;
  float *local_60;
  uint auStack_58 [10];
  
  bVar2 = *compressed;
  uVar12 = bVar2 >> 3 & 0xfffffffe;
  uVar18 = (uint)bVar2 + (uint)bVar2 & 0x1e;
  sVar7 = (sbyte)uVar12;
  __nmemb = 1L << (sbyte)uVar18;
  local_94 = (int)(1L << sVar7) - 1;
  local_98 = (int)__nmemb - 1;
  local_88 = calloc(1L << sVar7,4);
  __ptr_00 = calloc(__nmemb,4);
  bVar2 = compressed[1];
  *number_of_floats = (uint)bVar2 << 0x18;
  uVar9 = (uint)compressed[2] << 0x10 | (uint)bVar2 << 0x18;
  *number_of_floats = uVar9;
  uVar9 = (uint)compressed[3] << 8 | uVar9;
  *number_of_floats = uVar9;
  local_80 = compressed + 5;
  uVar9 = compressed[4] | uVar9;
  uVar11 = (ulong)uVar9;
  *number_of_floats = uVar9;
  pfVar6 = (float *)malloc(uVar11 * 4);
  __ptr = local_88;
  *out = pfVar6;
  uVar15 = 0;
  local_9c = uVar12;
  if (uVar9 < 8) {
    local_90 = pfVar6;
    uVar12 = 0;
    uVar13 = 0;
    uVar10 = 0;
    fVar14 = 0.0;
  }
  else {
    local_70 = number_of_floats;
    local_78 = uVar18;
    local_90 = (float *)0x0;
    fVar14 = 0.0;
    uVar10 = 0;
    uVar13 = 0;
    uVar12 = 0;
    uVar15 = 0;
    local_68 = (ulong)(uVar9 >> 3);
    local_74 = 0x20 - uVar18;
    do {
      local_60 = pfVar6;
      bVar2 = *local_80;
      bVar3 = local_80[1];
      bVar4 = local_80[2];
      local_80 = local_80 + 3;
      bVar8 = 0;
      lVar19 = 0;
      do {
        uVar20 = ((uint)bVar4 | (uint)bVar3 << 8 | (uint)bVar2 << 0x10) >> (bVar8 & 0x1f) & 7;
        auStack_58[lVar19] = uVar20;
        switch(uVar20) {
        case 0:
          auStack_c8[lVar19] = 0;
          goto LAB_001117eb;
        case 1:
          uVar20 = (uint)*local_80;
          local_80 = local_80 + 1;
          goto LAB_001117e6;
        case 2:
          uVar20 = (uint)*local_80 << 8;
          auStack_c8[lVar19] = uVar20;
          bVar5 = local_80[1];
          local_80 = local_80 + 2;
          break;
        default:
          bVar5 = *local_80;
          auStack_c8[lVar19] = (uint)bVar5 << 0x10;
          uVar20 = (uint)local_80[1] << 8 | (uint)bVar5 << 0x10;
          auStack_c8[lVar19] = uVar20;
          bVar5 = local_80[2];
          local_80 = local_80 + 3;
          break;
        case 4:
          bVar5 = *local_80;
          auStack_c8[lVar19] = (uint)bVar5 << 0x18;
          uVar20 = (uint)local_80[1] << 0x10 | (uint)bVar5 << 0x18;
          auStack_c8[lVar19] = uVar20;
          uVar20 = (uint)local_80[2] << 8 | uVar20;
          auStack_c8[lVar19] = uVar20;
          bVar5 = local_80[3];
          local_80 = local_80 + 4;
          goto LAB_001117e1;
        case 5:
          uVar20 = (uint)*local_80;
          local_80 = local_80 + 1;
          goto LAB_0011177a;
        case 6:
          uVar20 = (uint)*local_80 << 8;
          auStack_c8[lVar19] = uVar20;
          bVar5 = local_80[1];
          local_80 = local_80 + 2;
LAB_001117e1:
          uVar20 = bVar5 | uVar20;
LAB_001117e6:
          auStack_c8[lVar19] = uVar20;
          goto LAB_001117eb;
        }
        uVar20 = bVar5 | uVar20;
LAB_0011177a:
        auStack_c8[lVar19] = uVar20;
LAB_001117eb:
        lVar19 = lVar19 + 1;
        bVar8 = bVar8 + 3;
      } while (lVar19 != 8);
      lVar19 = 0;
      fVar16 = fVar14;
      do {
        if (*(uint *)((long)auStack_58 + lVar19) < 5) {
          uVar10 = uVar12;
        }
        fVar14 = (float)(uVar10 ^ *(uint *)((long)auStack_c8 + lVar19));
        *(float *)((long)local_88 + uVar15 * 4) = fVar14;
        uVar15 = (ulong)(((uint)fVar14 >> (0x20U - sVar7 & 0x1f) ^ (int)uVar15 << sVar7) & local_94)
        ;
        *(int *)((long)__ptr_00 + uVar13 * 4) = (int)fVar14 - (int)fVar16;
        uVar12 = *(uint *)((long)local_88 + uVar15 * 4);
        uVar13 = (ulong)(((uint)((int)fVar14 - (int)fVar16) >> ((byte)(0x20 - uVar18) & 0x1f) ^
                         (int)uVar13 << (sbyte)(uVar18 >> 1)) & local_98);
        uVar10 = *(int *)((long)__ptr_00 + uVar13 * 4) + (int)fVar14;
        *(float *)((long)local_60 + lVar19) = fVar14;
        lVar19 = lVar19 + 4;
        fVar16 = fVar14;
      } while (lVar19 != 0x20);
      uVar20 = (int)local_90 + 1;
      local_90 = (float *)(ulong)uVar20;
      pfVar6 = local_60 + 8;
    } while (uVar20 != uVar9 >> 3);
    uVar11 = (ulong)*number_of_floats;
    local_90 = local_60 + 8;
    uVar18 = local_78;
  }
  if ((uVar11 & 7) != 0) {
    bVar2 = *local_80;
    bVar3 = local_80[1];
    bVar4 = local_80[2];
    pbVar17 = local_80 + 3;
    uVar21 = 8;
    uVar11 = 0;
    auStack_58[0] = bVar4 & 7;
    bVar8 = 0;
    switch(auStack_58[0]) {
    case 0:
      goto switchD_00111923_caseD_0;
    case 1:
      goto switchD_00111923_caseD_1;
    default:
      goto switchD_00111923_caseD_2;
    case 3:
    case 7:
      goto switchD_00111923_caseD_3;
    case 4:
      goto switchD_00111923_caseD_4;
    case 5:
      goto switchD_00111923_caseD_5;
    }
  }
LAB_001119c4:
  free(__ptr);
  free(__ptr_00);
  return;
switchD_00111923_caseD_0:
  auStack_c8[uVar11] = 0;
LAB_00111aa3:
  uVar11 = uVar11 + 1;
  if ((long)(int)uVar21 <= (long)uVar11) {
    if (0 < (int)uVar21) {
      uVar11 = 0;
      do {
        if (auStack_58[uVar11] < 5) {
          uVar10 = uVar12;
        }
        fVar16 = (float)(uVar10 ^ auStack_c8[uVar11]);
        *(float *)((long)__ptr + uVar15 * 4) = fVar16;
        uVar9 = ((uint)fVar16 >> (0x20 - (byte)local_9c & 0x1f) ^
                (int)uVar15 << ((byte)local_9c & 0x1f)) & local_94;
        *(int *)((long)__ptr_00 + uVar13 * 4) = (int)fVar16 - (int)fVar14;
        uVar12 = *(uint *)((long)__ptr + (ulong)uVar9 * 4);
        uVar13 = (ulong)(((uint)((int)fVar16 - (int)fVar14) >> (0x20U - (char)uVar18 & 0x1f) ^
                         (int)uVar13 << (sbyte)(uVar18 >> 1)) & local_98);
        uVar10 = *(int *)((long)__ptr_00 + uVar13 * 4) + (int)fVar16;
        local_90[uVar11] = fVar16;
        uVar11 = uVar11 + 1;
        uVar15 = (ulong)uVar9;
        fVar14 = fVar16;
      } while (uVar21 != uVar11);
    }
    goto LAB_001119c4;
  }
  bVar8 = bVar8 + 3;
  uVar9 = ((uint)bVar4 | (uint)bVar3 << 8 | (uint)bVar2 << 0x10) >> (bVar8 & 0x1f) & 7;
  auStack_58[uVar11] = uVar9;
  switch(uVar9) {
  case 0:
    goto switchD_00111923_caseD_0;
  case 1:
switchD_00111923_caseD_1:
    bVar5 = *pbVar17;
    pbVar17 = pbVar17 + 1;
    auStack_c8[uVar11] = (uint)bVar5;
    if (bVar5 == 0) {
      uVar21 = uVar11 & 0xffffffff;
    }
    goto LAB_00111aa3;
  default:
switchD_00111923_caseD_2:
    uVar9 = (uint)*pbVar17 << 8;
    auStack_c8[uVar11] = uVar9;
    bVar5 = pbVar17[1];
    pbVar17 = pbVar17 + 2;
    break;
  case 3:
  case 7:
switchD_00111923_caseD_3:
    bVar5 = *pbVar17;
    auStack_c8[uVar11] = (uint)bVar5 << 0x10;
    uVar9 = (uint)pbVar17[1] << 8 | (uint)bVar5 << 0x10;
    auStack_c8[uVar11] = uVar9;
    pbVar1 = pbVar17 + 2;
    pbVar17 = pbVar17 + 3;
    uVar9 = *pbVar1 | uVar9;
    goto LAB_00111a9f;
  case 4:
switchD_00111923_caseD_4:
    bVar5 = *pbVar17;
    auStack_c8[uVar11] = (uint)bVar5 << 0x18;
    uVar9 = (uint)pbVar17[1] << 0x10 | (uint)bVar5 << 0x18;
    auStack_c8[uVar11] = uVar9;
    uVar9 = (uint)pbVar17[2] << 8 | uVar9;
    auStack_c8[uVar11] = uVar9;
    bVar5 = pbVar17[3];
    pbVar17 = pbVar17 + 4;
    break;
  case 5:
switchD_00111923_caseD_5:
    uVar9 = (uint)*pbVar17;
    pbVar17 = pbVar17 + 1;
LAB_00111a9f:
    auStack_c8[uVar11] = uVar9;
    goto LAB_00111aa3;
  }
  auStack_c8[uVar11] = bVar5 | uVar9;
  goto LAB_00111aa3;
}

Assistant:

void trico_decompress(uint32_t* number_of_floats, float** out, const uint8_t* compressed)
  {
  uint8_t hash_info = *compressed++;

  uint32_t hash1_size_exponent = (hash_info >> 4) << 1;
  uint32_t hash2_size_exponent = (hash_info & 15) << 1;

  const uint32_t hash1_size = 1 << hash1_size_exponent;
  const uint32_t hash2_size = 1 << hash2_size_exponent;
  const uint32_t hash1_mask = hash1_size - 1;
  const uint32_t hash2_mask = hash2_size - 1;

  uint32_t* hash_table_1 = (uint32_t*)trico_calloc(hash1_size, 4);
  uint32_t* hash_table_2 = (uint32_t*)trico_calloc(hash2_size, 4);

  *number_of_floats = ((uint32_t)(*compressed++)) << 24;
  *number_of_floats |= ((uint32_t)(*compressed++)) << 16;
  *number_of_floats |= ((uint32_t)(*compressed++)) << 8;
  *number_of_floats |= ((uint32_t)(*compressed++));
  *out = (float*)trico_malloc(*number_of_floats * sizeof(float));

  uint32_t bc;
  uint32_t bcode[8];
  uint32_t xor[8];
  uint32_t value;
  uint32_t hash1 = 0;
  uint32_t prediction1 = 0;
  uint32_t hash2 = 0;
  uint32_t prediction2 = 0;
  uint32_t stride;
  uint32_t last_value = 0;
  uint32_t* p_out = (uint32_t*)(*out);

  const uint32_t cnt = *number_of_floats / 8;
  for (uint32_t q = 0; q < cnt; ++q)
    {
    bc = ((uint32_t)(*compressed++)) << 16;
    bc |= ((uint32_t)(*compressed++)) << 8;
    bc |= (*compressed++);
    for (int j = 0; j < 8; ++j)
      {
      uint8_t b = (bc >> (j * 3)) & 7;
      bcode[j] = b;
      switch (b)
        {
        case 0:
        {
        xor[j] = 0;
        break;
        }
        case 1:
        {
        xor[j] = ((uint32_t)(*compressed++));
        break;
        }
        case 2:
        {
        xor[j] = ((uint32_t)(*compressed++)) << 8;
        xor[j] |= ((uint32_t)(*compressed++));
        break;
        }
        case 3:
        {
        xor[j] = ((uint32_t)(*compressed++)) << 16;
        xor[j] |= ((uint32_t)(*compressed++)) << 8;
        xor[j] |= ((uint32_t)(*compressed++));
        break;
        }
        case 4:
        {
        xor[j] = ((uint32_t)(*compressed++)) << 24;
        xor[j] |= ((uint32_t)(*compressed++)) << 16;
        xor[j] |= ((uint32_t)(*compressed++)) << 8;
        xor[j] |= ((uint32_t)(*compressed++));
        break;
        }
        case 5:
        {
        xor[j] = ((uint32_t)(*compressed++));
        break;
        }
        case 6:
        {
        xor[j] = ((uint32_t)(*compressed++)) << 8;
        xor[j] |= ((uint32_t)(*compressed++));
        break;
        }
        case 7:
        {
        xor[j] = ((uint32_t)(*compressed++)) << 16;
        xor[j] |= ((uint32_t)(*compressed++)) << 8;
        xor[j] |= ((uint32_t)(*compressed++));
        break;
        }
        }
      }
    for (int j = 0; j < 8; ++j)
      {
      if (bcode[j] > 4)
        prediction1 = prediction2;

      value = xor[j] ^ prediction1;

      hash_table_1[hash1] = value;
      hash1 = trico_compute_hash1_32(hash1, value, hash1_size_exponent, hash1_mask);
      prediction1 = hash_table_1[hash1];

      stride = value - last_value;
      hash_table_2[hash2] = stride;
      hash2 = trico_compute_hash2_32(hash2, stride, hash2_size_exponent, hash2_mask);
      prediction2 = value + hash_table_2[hash2];
      last_value = value;

      *p_out++ = value;
      }
    }

  if (*number_of_floats & 7)
    {
    bc = ((uint32_t)(*compressed++)) << 16;
    bc |= ((uint32_t)(*compressed++)) << 8;
    bc |= (*compressed++);
    int max_j = 8;
    for (int j = 0; j < max_j; ++j)
      {
      uint8_t b = (bc >> (j * 3)) & 7;
      bcode[j] = b;
      switch (b)
        {
        case 0:
        {
        xor[j] = 0;
        break;
        }
        case 1:
        {
        xor[j] = ((uint32_t)(*compressed++));
        if (xor[j] == 0)
          max_j = j;
        break;
        }
        case 2:
        {
        xor[j] = ((uint32_t)(*compressed++)) << 8;
        xor[j] |= ((uint32_t)(*compressed++));
        break;
        }
        case 3:
        {
        xor[j] = ((uint32_t)(*compressed++)) << 16;
        xor[j] |= ((uint32_t)(*compressed++)) << 8;
        xor[j] |= ((uint32_t)(*compressed++));
        break;
        }
        case 4:
        {
        xor[j] = ((uint32_t)(*compressed++)) << 24;
        xor[j] |= ((uint32_t)(*compressed++)) << 16;
        xor[j] |= ((uint32_t)(*compressed++)) << 8;
        xor[j] |= ((uint32_t)(*compressed++));
        break;
        }
        case 5:
        {
        xor[j] = ((uint32_t)(*compressed++));
        break;
        }
        case 6:
        {
        xor[j] = ((uint32_t)(*compressed++)) << 8;
        xor[j] |= ((uint32_t)(*compressed++));
        break;
        }
        case 7:
        {
        xor[j] = ((uint32_t)(*compressed++)) << 16;
        xor[j] |= ((uint32_t)(*compressed++)) << 8;
        xor[j] |= ((uint32_t)(*compressed++));
        break;
        }
        }
      }
    for (int j = 0; j < max_j; ++j)
      {
      if (bcode[j] > 4)
        prediction1 = prediction2;

      value = xor[j] ^ prediction1;

      hash_table_1[hash1] = value;
      hash1 = trico_compute_hash1_32(hash1, value, hash1_size_exponent, hash1_mask);
      prediction1 = hash_table_1[hash1];

      stride = value - last_value;
      hash_table_2[hash2] = stride;
      hash2 = trico_compute_hash2_32(hash2, stride, hash2_size_exponent, hash2_mask);
      prediction2 = value + hash_table_2[hash2];
      last_value = value;

      *p_out++ = value;
      }
    }

  trico_free(hash_table_1);
  trico_free(hash_table_2);
  }